

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestOneofParsingLite::_InternalSerialize
          (TestOneofParsingLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestAllTypesLite *value;
  string_view sVar1;
  bool bVar2;
  OneofFieldCase OVar3;
  int32_t value_00;
  V2EnumLite value_01;
  int iVar4;
  Cord *s;
  string *psVar5;
  uint8_t *target_00;
  void *data;
  string *_s_4;
  string *_s_3;
  string *_s_2;
  string *_s_1;
  string *_s;
  uint32_t cached_has_bits;
  TestOneofParsingLite *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestOneofParsingLite *this_local;
  
  OVar3 = oneof_field_case(this);
  stream_local = (EpsCopyOutputStream *)target;
  switch(OVar3) {
  case kOneofInt32:
    value_00 = _internal_oneof_int32(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             (stream,value_00,target);
    break;
  case kOneofSubmessage:
    value = (this->field_0)._impl_.oneof_field_.oneof_submessage_;
    iVar4 = TestAllTypesLite::GetCachedSize((this->field_0)._impl_.oneof_field_.oneof_submessage_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (2,&value->super_MessageLite,iVar4,target,stream);
    break;
  case kOneofString:
    psVar5 = _internal_oneof_string_abi_cxx11_(this);
    sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,3,sVar1,target);
    break;
  case kOneofBytes:
    psVar5 = _internal_oneof_bytes_abi_cxx11_(this);
    sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteBytesMaybeAliased
                             (stream,4,sVar1,target);
    break;
  case kOneofStringCord:
    psVar5 = _internal_oneof_string_cord_abi_cxx11_(this);
    sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,5,sVar1,target);
    break;
  case kOneofBytesCord:
    s = _internal_oneof_bytes_cord(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteBytes<absl::lts_20250127::Cord>
                             (stream,6,s,target);
    break;
  case kOneofStringStringPiece:
    psVar5 = _internal_oneof_string_string_piece_abi_cxx11_(this);
    sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,7,sVar1,target);
    break;
  case kOneofBytesStringPiece:
    psVar5 = _internal_oneof_bytes_string_piece_abi_cxx11_(this);
    sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteBytesMaybeAliased
                             (stream,8,sVar1,target);
    break;
  case kOneofEnum:
    target_00 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value_01 = _internal_oneof_enum(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray
                             (9,value_01,target_00);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar4 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar4,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestOneofParsingLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestOneofParsingLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestOneofParsingLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  switch (this_.oneof_field_case()) {
    case kOneofInt32: {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
              stream, this_._internal_oneof_int32(), target);
      break;
    }
    case kOneofSubmessage: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          2, *this_._impl_.oneof_field_.oneof_submessage_, this_._impl_.oneof_field_.oneof_submessage_->GetCachedSize(), target,
          stream);
      break;
    }
    case kOneofString: {
      const ::std::string& _s = this_._internal_oneof_string();
      target = stream->WriteStringMaybeAliased(3, _s, target);
      break;
    }
    case kOneofBytes: {
      const ::std::string& _s = this_._internal_oneof_bytes();
      target = stream->WriteBytesMaybeAliased(4, _s, target);
      break;
    }
    case kOneofStringCord: {
      const ::std::string& _s = this_._internal_oneof_string_cord();
      target = stream->WriteStringMaybeAliased(5, _s, target);
      break;
    }
    case kOneofBytesCord: {
      target = stream->WriteBytes(6, this_._internal_oneof_bytes_cord(), target);
      break;
    }
    case kOneofStringStringPiece: {
      const ::std::string& _s = this_._internal_oneof_string_string_piece();
      target = stream->WriteStringMaybeAliased(7, _s, target);
      break;
    }
    case kOneofBytesStringPiece: {
      const ::std::string& _s = this_._internal_oneof_bytes_string_piece();
      target = stream->WriteBytesMaybeAliased(8, _s, target);
      break;
    }
    case kOneofEnum: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          9, this_._internal_oneof_enum(), target);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestOneofParsingLite)
  return target;
}